

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000011,one) == 0) {
    pcVar4 = GetDefinitionIfUnquoted(this,arg);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = cmExpandedCommandArgument::c_str(arg);
      iVar3 = atoi(pcVar4);
      if (iVar3 == 0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = cmExpandedCommandArgument::c_str(arg);
      }
    }
  }
  else {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"0","");
    bVar2 = cmExpandedCommandArgument::operator==(arg,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      return false;
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"1","");
    bVar2 = cmExpandedCommandArgument::operator==(arg,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      return true;
    }
    pcVar4 = GetDefinitionIfUnquoted(this,arg);
  }
  bVar2 = cmSystemTools::IsOff(pcVar4);
  return !bVar2;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if (one) {
    // Old IsTrue behavior for single argument.
    if (arg == "0") {
      return false;
    }
    if (arg == "1") {
      return true;
    }
    const char* def = this->GetDefinitionIfUnquoted(arg);
    return !cmSystemTools::IsOff(def);
  }
  // Old GetVariableOrNumber behavior.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  if (!def && atoi(arg.c_str())) {
    def = arg.c_str();
  }
  return !cmSystemTools::IsOff(def);
}